

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# redblacktree.h
# Opt level: O0

bool __thiscall
snmalloc::
RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
::remove_path(RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
              *this,RBPath *path)

{
  bool bVar1;
  ChildRef CVar2;
  K curr_00;
  RBPath *in_RSI;
  H in_RDI;
  K r_nibling_opp;
  K r_nibling_same;
  K r_nibling_1;
  K o_nibling;
  K r_nibling;
  K nibling;
  K sibling;
  bool cur_dir;
  K parent;
  bool leaf_red;
  K child;
  K curr;
  ChildRef splice;
  RBPath *in_stack_fffffffffffffbe8;
  RBPath *in_stack_fffffffffffffbf0;
  undefined1 direction;
  K in_stack_fffffffffffffbf8;
  Contents in_stack_fffffffffffffc00;
  RBPath *pRVar3;
  char *in_stack_fffffffffffffc08;
  RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
  *in_stack_fffffffffffffc10;
  RBPath *in_stack_fffffffffffffc18;
  RBPath *in_stack_fffffffffffffc20;
  undefined8 in_stack_fffffffffffffc28;
  RBPath *in_stack_fffffffffffffc30;
  ChildRef in_stack_fffffffffffffc48;
  ChildRef local_f8;
  H local_f0;
  FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  *local_e8;
  FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  *local_e0;
  H local_d8;
  FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  *local_d0;
  H local_c8;
  FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  *local_c0;
  FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  *local_b8;
  H local_b0;
  FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  *local_a8;
  H local_a0;
  FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  *local_98;
  FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  *local_90;
  FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  *local_88;
  H local_80;
  H local_78;
  FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  *local_70;
  byte local_61;
  H local_60;
  FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  *local_58;
  H local_50;
  FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  *local_48;
  H local_40;
  FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  *local_38;
  H local_30;
  FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  *local_28;
  ChildRef local_20;
  RBPath *local_18;
  
  local_18 = in_RSI;
  local_20 = RBPath::curr(in_stack_fffffffffffffbe8);
  debug_log(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
            (RBPath *)in_stack_fffffffffffffc00.unsafe_capptr);
  RBPath::move(in_stack_fffffffffffffc18,SUB81((ulong)in_stack_fffffffffffffc10 >> 0x38,0));
  do {
    bVar1 = RBPath::move(in_stack_fffffffffffffc18,SUB81((ulong)in_stack_fffffffffffffc10 >> 0x38,0)
                        );
  } while (bVar1);
  local_30.val = (uintptr_t *)RBPath::curr(in_stack_fffffffffffffbe8);
  local_28 = (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
              *)snmalloc::RBTree::ChildRef::operator_cast_to_CapPtr
                          ((ChildRef *)in_stack_fffffffffffffbe8);
  local_50.val = (uintptr_t *)RBPath::curr(in_stack_fffffffffffffbe8);
  local_48 = (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
              *)snmalloc::RBTree::ChildRef::operator_cast_to_CapPtr
                          ((ChildRef *)in_stack_fffffffffffffbe8);
  local_40.val = (uintptr_t *)
                 get_dir(SUB81((ulong)in_stack_fffffffffffffbf0 >> 0x38,0),in_stack_fffffffffffffbf8
                        );
  local_58 = (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
              *)snmalloc::RBTree::ChildRef::operator_cast_to_CapPtr
                          ((ChildRef *)in_stack_fffffffffffffbe8);
  local_38 = local_58;
  local_60.val = (uintptr_t *)RBPath::curr(in_stack_fffffffffffffbe8);
  ChildRef::operator=((ChildRef *)in_stack_fffffffffffffbf8.unsafe_capptr,
                      (K)in_stack_fffffffffffffc00.unsafe_capptr);
  local_70 = local_28;
  local_61 = BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
             ::is_red(in_stack_fffffffffffffc00);
  local_78.val = (uintptr_t *)RBPath::curr(in_stack_fffffffffffffbe8);
  local_80 = local_20.ptr.val;
  bVar1 = ChildRef::operator!=((ChildRef *)&local_78,local_20);
  if (bVar1) {
    local_88 = local_28;
    local_90 = (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
                *)snmalloc::RBTree::ChildRef::operator_cast_to_CapPtr
                            ((ChildRef *)in_stack_fffffffffffffbe8);
    BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
    ::is_red(in_stack_fffffffffffffc00);
    BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
    ::set_red((Contents)in_stack_fffffffffffffc48.ptr.val,SUB81((ulong)in_RDI.val >> 0x38,0));
    local_a8 = (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
                *)snmalloc::RBTree::ChildRef::operator_cast_to_CapPtr
                            ((ChildRef *)in_stack_fffffffffffffbe8);
    local_a0.val = (uintptr_t *)
                   get_dir(SUB81((ulong)in_stack_fffffffffffffbf0 >> 0x38,0),
                           in_stack_fffffffffffffbf8);
    local_98 = (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
                *)snmalloc::RBTree::ChildRef::operator_cast_to_CapPtr
                            ((ChildRef *)in_stack_fffffffffffffbe8);
    local_b8 = local_28;
    local_b0.val = (uintptr_t *)
                   get_dir(SUB81((ulong)in_stack_fffffffffffffbf0 >> 0x38,0),
                           in_stack_fffffffffffffbf8);
    ChildRef::operator=((ChildRef *)in_stack_fffffffffffffbf8.unsafe_capptr,
                        (K)in_stack_fffffffffffffc00.unsafe_capptr);
    local_d0 = (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
                *)snmalloc::RBTree::ChildRef::operator_cast_to_CapPtr
                            ((ChildRef *)in_stack_fffffffffffffbe8);
    local_c8.val = (uintptr_t *)
                   get_dir(SUB81((ulong)in_stack_fffffffffffffbf0 >> 0x38,0),
                           in_stack_fffffffffffffbf8);
    local_c0 = (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
                *)snmalloc::RBTree::ChildRef::operator_cast_to_CapPtr
                            ((ChildRef *)in_stack_fffffffffffffbe8);
    local_e0 = local_28;
    local_d8.val = (uintptr_t *)
                   get_dir(SUB81((ulong)in_stack_fffffffffffffbf0 >> 0x38,0),
                           in_stack_fffffffffffffbf8);
    ChildRef::operator=((ChildRef *)in_stack_fffffffffffffbf8.unsafe_capptr,
                        (K)in_stack_fffffffffffffc00.unsafe_capptr);
    local_e8 = local_28;
    ChildRef::operator=((ChildRef *)in_stack_fffffffffffffbf8.unsafe_capptr,
                        (K)in_stack_fffffffffffffc00.unsafe_capptr);
    RBPath::fixup(in_stack_fffffffffffffc30,SUB81((ulong)in_stack_fffffffffffffc28 >> 0x38,0));
  }
  debug_log(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
            (RBPath *)in_stack_fffffffffffffc00.unsafe_capptr);
  if ((local_61 & 1) == 0) {
    while( true ) {
      local_f0.val = (uintptr_t *)RBPath::curr(in_stack_fffffffffffffbe8);
      ChildRef::ChildRef((ChildRef *)&local_f8,in_RDI);
      bVar1 = ChildRef::operator!=((ChildRef *)&local_f0,local_f8);
      if (!bVar1) break;
      RBPath::parent(in_stack_fffffffffffffbe8);
      snmalloc::RBTree::ChildRef::operator_cast_to_CapPtr((ChildRef *)in_stack_fffffffffffffbe8);
      RBPath::curr_dir((RBPath *)0x11512b);
      get_dir(SUB81((ulong)in_stack_fffffffffffffbf0 >> 0x38,0),in_stack_fffffffffffffbf8);
      snmalloc::RBTree::ChildRef::operator_cast_to_CapPtr((ChildRef *)in_stack_fffffffffffffbe8);
      bVar1 = BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
              ::is_red(in_stack_fffffffffffffc00);
      direction = (undefined1)((ulong)in_stack_fffffffffffffbf0 >> 0x38);
      if (bVar1) {
        pRVar3 = local_18;
        CVar2 = RBPath::parent(in_stack_fffffffffffffbe8);
        debug_log((RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
                   *)in_RDI.val,"Red sibling",pRVar3,CVar2);
        get_dir(SUB81((ulong)in_stack_fffffffffffffbf0 >> 0x38,0),in_stack_fffffffffffffbf8);
        snmalloc::RBTree::ChildRef::operator_cast_to_CapPtr((ChildRef *)in_stack_fffffffffffffbe8);
        get_dir(SUB81((ulong)in_stack_fffffffffffffbf0 >> 0x38,0),in_stack_fffffffffffffbf8);
        ChildRef::operator=((ChildRef *)in_stack_fffffffffffffbf8.unsafe_capptr,
                            (K)in_stack_fffffffffffffc00.unsafe_capptr);
        get_dir(SUB81((ulong)in_stack_fffffffffffffbf0 >> 0x38,0),in_stack_fffffffffffffbf8);
        ChildRef::operator=((ChildRef *)in_stack_fffffffffffffbf8.unsafe_capptr,
                            (K)in_stack_fffffffffffffc00.unsafe_capptr);
        BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
        ::set_red((Contents)in_stack_fffffffffffffc48.ptr.val,SUB81((ulong)in_RDI.val >> 0x38,0));
        BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
        ::set_red((Contents)in_stack_fffffffffffffc48.ptr.val,SUB81((ulong)in_RDI.val >> 0x38,0));
        RBPath::parent(in_stack_fffffffffffffbe8);
        ChildRef::operator=((ChildRef *)in_stack_fffffffffffffbf8.unsafe_capptr,
                            (K)in_stack_fffffffffffffc00.unsafe_capptr);
        RBPath::pop(local_18);
        RBPath::move(in_stack_fffffffffffffc18,SUB81((ulong)in_stack_fffffffffffffc10 >> 0x38,0));
        RBPath::move_inc_null
                  (in_stack_fffffffffffffc20,SUB81((ulong)in_stack_fffffffffffffc18 >> 0x38,0));
        RBPath::fixup(pRVar3,SUB81((ulong)in_stack_fffffffffffffc28 >> 0x38,0));
        pRVar3 = local_18;
        CVar2 = RBPath::parent(in_stack_fffffffffffffbe8);
        debug_log((RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
                   *)in_RDI.val,"Red sibling - done",pRVar3,CVar2);
      }
      else {
        get_dir((bool)direction,in_stack_fffffffffffffbf8);
        snmalloc::RBTree::ChildRef::operator_cast_to_CapPtr((ChildRef *)in_stack_fffffffffffffbe8);
        bVar1 = BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
                ::is_red(in_stack_fffffffffffffc00);
        if (bVar1) {
          pRVar3 = local_18;
          CVar2 = RBPath::parent(in_stack_fffffffffffffbe8);
          debug_log((RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
                     *)in_RDI.val,"Red nibling 1",pRVar3,CVar2);
          get_dir((bool)direction,in_stack_fffffffffffffbf8);
          snmalloc::RBTree::ChildRef::operator_cast_to_CapPtr((ChildRef *)in_stack_fffffffffffffbe8)
          ;
          get_dir((bool)direction,in_stack_fffffffffffffbf8);
          snmalloc::RBTree::ChildRef::operator_cast_to_CapPtr((ChildRef *)in_stack_fffffffffffffbe8)
          ;
          get_dir((bool)direction,in_stack_fffffffffffffbf8);
          ChildRef::operator=((ChildRef *)in_stack_fffffffffffffbf8.unsafe_capptr,
                              (K)in_stack_fffffffffffffc00.unsafe_capptr);
          get_dir((bool)direction,in_stack_fffffffffffffbf8);
          ChildRef::operator=((ChildRef *)in_stack_fffffffffffffbf8.unsafe_capptr,
                              (K)in_stack_fffffffffffffc00.unsafe_capptr);
          RBPath::parent(in_stack_fffffffffffffbe8);
          ChildRef::operator=((ChildRef *)in_stack_fffffffffffffbf8.unsafe_capptr,
                              (K)in_stack_fffffffffffffc00.unsafe_capptr);
          BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
          ::set_red((Contents)in_stack_fffffffffffffc48.ptr.val,SUB81((ulong)in_RDI.val >> 0x38,0));
          BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
          ::is_red(in_stack_fffffffffffffc00);
          BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
          ::set_red((Contents)in_stack_fffffffffffffc48.ptr.val,SUB81((ulong)in_RDI.val >> 0x38,0));
          BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
          ::set_red((Contents)in_stack_fffffffffffffc48.ptr.val,SUB81((ulong)in_RDI.val >> 0x38,0));
          CVar2 = RBPath::parent(in_stack_fffffffffffffbe8);
          debug_log((RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
                     *)in_RDI.val,"Red nibling 1 - done",local_18,CVar2);
          return true;
        }
        get_dir((bool)direction,in_stack_fffffffffffffbf8);
        snmalloc::RBTree::ChildRef::operator_cast_to_CapPtr((ChildRef *)in_stack_fffffffffffffbe8);
        bVar1 = BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
                ::is_red(in_stack_fffffffffffffc00);
        if (bVar1) {
          pRVar3 = local_18;
          CVar2 = RBPath::parent(in_stack_fffffffffffffbe8);
          debug_log((RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
                     *)in_RDI.val,"Red nibling 2",pRVar3,CVar2);
          get_dir((bool)direction,in_stack_fffffffffffffbf8);
          snmalloc::RBTree::ChildRef::operator_cast_to_CapPtr((ChildRef *)in_stack_fffffffffffffbe8)
          ;
          get_dir((bool)direction,in_stack_fffffffffffffbf8);
          snmalloc::RBTree::ChildRef::operator_cast_to_CapPtr((ChildRef *)in_stack_fffffffffffffbe8)
          ;
          get_dir((bool)direction,in_stack_fffffffffffffbf8);
          snmalloc::RBTree::ChildRef::operator_cast_to_CapPtr((ChildRef *)in_stack_fffffffffffffbe8)
          ;
          get_dir((bool)direction,in_stack_fffffffffffffbf8);
          ChildRef::operator=((ChildRef *)in_stack_fffffffffffffbf8.unsafe_capptr,
                              (K)in_stack_fffffffffffffc00.unsafe_capptr);
          get_dir((bool)direction,in_stack_fffffffffffffbf8);
          ChildRef::operator=((ChildRef *)in_stack_fffffffffffffbf8.unsafe_capptr,
                              (K)in_stack_fffffffffffffc00.unsafe_capptr);
          get_dir((bool)direction,in_stack_fffffffffffffbf8);
          ChildRef::operator=((ChildRef *)in_stack_fffffffffffffbf8.unsafe_capptr,
                              (K)in_stack_fffffffffffffc00.unsafe_capptr);
          get_dir((bool)direction,in_stack_fffffffffffffbf8);
          ChildRef::operator=((ChildRef *)in_stack_fffffffffffffbf8.unsafe_capptr,
                              (K)in_stack_fffffffffffffc00.unsafe_capptr);
          RBPath::parent(in_stack_fffffffffffffbe8);
          ChildRef::operator=((ChildRef *)in_stack_fffffffffffffbf8.unsafe_capptr,
                              (K)in_stack_fffffffffffffc00.unsafe_capptr);
          BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
          ::is_red(in_stack_fffffffffffffc00);
          BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
          ::set_red((Contents)in_stack_fffffffffffffc48.ptr.val,SUB81((ulong)in_RDI.val >> 0x38,0));
          BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
          ::set_red((Contents)in_stack_fffffffffffffc48.ptr.val,SUB81((ulong)in_RDI.val >> 0x38,0));
          CVar2 = RBPath::parent(in_stack_fffffffffffffbe8);
          debug_log((RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
                     *)in_RDI.val,"Red nibling 2 - done",local_18,CVar2);
          return true;
        }
        bVar1 = BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
                ::is_red(in_stack_fffffffffffffc00);
        if (bVar1) {
          pRVar3 = local_18;
          CVar2 = RBPath::parent(in_stack_fffffffffffffbe8);
          debug_log((RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
                     *)in_RDI.val,"Black sibling and red parent case",pRVar3,CVar2);
          BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
          ::set_red((Contents)in_stack_fffffffffffffc48.ptr.val,SUB81((ulong)in_RDI.val >> 0x38,0));
          BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
          ::set_red((Contents)in_stack_fffffffffffffc48.ptr.val,SUB81((ulong)in_RDI.val >> 0x38,0));
          CVar2 = RBPath::parent(in_stack_fffffffffffffbe8);
          debug_log((RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
                     *)in_RDI.val,"Black sibling and red parent case - done",local_18,CVar2);
          return true;
        }
        in_stack_fffffffffffffbf0 = local_18;
        CVar2 = RBPath::parent(in_stack_fffffffffffffbe8);
        debug_log((RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
                   *)in_RDI.val,"Black sibling, niblings and black parent case",
                  in_stack_fffffffffffffbf0,CVar2);
        BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
        ::set_red((Contents)in_stack_fffffffffffffc48.ptr.val,SUB81((ulong)in_RDI.val >> 0x38,0));
        RBPath::pop(local_18);
        RBPath::curr(in_stack_fffffffffffffbe8);
        curr_00 = snmalloc::RBTree::ChildRef::operator_cast_to_CapPtr
                            ((ChildRef *)in_stack_fffffffffffffbe8);
        invariant((RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
                   *)in_RDI.val,curr_00,
                  (K)(FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
                      *)0x0,
                  (K)(FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
                      *)0x0);
        in_stack_fffffffffffffbf8.unsafe_capptr =
             (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
              *)local_18;
        in_stack_fffffffffffffc48 = RBPath::curr(in_stack_fffffffffffffbe8);
        debug_log((RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
                   *)in_RDI.val,"Black sibling, niblings and black parent case - done",
                  (RBPath *)in_stack_fffffffffffffbf8.unsafe_capptr,in_stack_fffffffffffffc48);
      }
    }
  }
  return true;
}

Assistant:

bool remove_path(RBPath& path)
    {
      ChildRef splice = path.curr();
      SNMALLOC_ASSERT(!(splice.is_null()));

      debug_log("Removing", path);

      /*
       * Find immediately smaller leaf element (rightmost descendant of left
       * child) to serve as the replacement for this node.  We may not have a
       * left subtree, so this may not move the path at all.
       */
      path.move(true);
      while (path.move(false))
      {}

      K curr = path.curr();

      {
        // Locally extract right-child-less replacement, replacing it with its
        // left child, if any
        K child = get_dir(true, path.curr());
        // Unlink target replacing with possible child.
        path.curr() = child;
      }

      bool leaf_red = Rep::is_red(curr);

      if (path.curr() != splice)
      {
        // If we had a left child, replace ourselves with the extracted value
        // from above
        Rep::set_red(curr, Rep::is_red(splice));
        get_dir(true, curr) = K{get_dir(true, splice)};
        get_dir(false, curr) = K{get_dir(false, splice)};
        splice = curr;
        path.fixup();
      }

      debug_log("Splice done", path);

      // TODO: Clear node contents?

      // Red leaf removal requires no rebalancing.
      if (leaf_red)
        return true;

      // Now in the double black case.
      // End of path is considered double black, that is, one black element
      // shorter than satisfies the invariant. The following algorithm moves up
      // the path until it finds a close red element or the root. If we convert
      // the tree to one, in which the root is double black, then the algorithm
      // is complete, as there is nothing to be out of balance with. Otherwise,
      // we are searching for nearby red elements so we can rotate the tree to
      // rebalance. The following slides nicely cover the case analysis below
      //   https://www.cs.purdue.edu/homes/ayg/CS251/slides/chap13c.pdf
      while (path.curr() != ChildRef(H{&root}))
      {
        K parent = path.parent();
        bool cur_dir = path.curr_dir();
        K sibling = get_dir(!cur_dir, parent);

        /* Handle red sibling case.
         * This performs a rotation to give a black sibling.
         *
         *         p                           s(b)
         *        / \                         /   \
         *       c   s(r)        -->         p(r)  m
         *          /  \                    / \
         *         n    m                  c   n
         *
         * By invariant we know that p, n and m are all initially black.
         */
        if (Rep::is_red(sibling))
        {
          debug_log("Red sibling", path, path.parent());
          K nibling = get_dir(cur_dir, sibling);
          get_dir(!cur_dir, parent) = nibling;
          get_dir(cur_dir, sibling) = parent;
          Rep::set_red(parent, true);
          Rep::set_red(sibling, false);
          path.parent() = sibling;
          // Manually fix path.  Using path.fixup would alter the complexity
          // class.
          path.pop();
          path.move(cur_dir);
          path.move_inc_null(cur_dir);
          path.fixup(false);
          debug_log("Red sibling - done", path, path.parent());
          continue;
        }

        /* Handle red nibling case 1.
         *          <p>                  <s>
         *          / \                  / \
         *         c   s         -->    p   rn
         *            / \              / \
         *          on   rn           c   on
         */
        if (Rep::is_red(get_dir(!cur_dir, sibling)))
        {
          debug_log("Red nibling 1", path, path.parent());
          K r_nibling = get_dir(!cur_dir, sibling);
          K o_nibling = get_dir(cur_dir, sibling);
          get_dir(cur_dir, sibling) = parent;
          get_dir(!cur_dir, parent) = o_nibling;
          path.parent() = sibling;
          Rep::set_red(r_nibling, false);
          Rep::set_red(sibling, Rep::is_red(parent));
          Rep::set_red(parent, false);
          debug_log("Red nibling 1 - done", path, path.parent());
          break;
        }

        /* Handle red nibling case 2.
         *         <p>                   <rn>
         *         / \                  /    \
         *        c   s         -->    p      s
         *           / \              / \    / \
         *         rn   on           c  rno rns on
         *         / \
         *       rno  rns
         */
        if (Rep::is_red(get_dir(cur_dir, sibling)))
        {
          debug_log("Red nibling 2", path, path.parent());
          K r_nibling = get_dir(cur_dir, sibling);
          K r_nibling_same = get_dir(cur_dir, r_nibling);
          K r_nibling_opp = get_dir(!cur_dir, r_nibling);
          get_dir(!cur_dir, parent) = r_nibling_same;
          get_dir(cur_dir, sibling) = r_nibling_opp;
          get_dir(cur_dir, r_nibling) = parent;
          get_dir(!cur_dir, r_nibling) = sibling;
          path.parent() = r_nibling;
          Rep::set_red(r_nibling, Rep::is_red(parent));
          Rep::set_red(parent, false);
          debug_log("Red nibling 2 - done", path, path.parent());
          break;
        }

        // Handle black sibling and niblings, and red parent.
        if (Rep::is_red(parent))
        {
          debug_log("Black sibling and red parent case", path, path.parent());
          Rep::set_red(parent, false);
          Rep::set_red(sibling, true);
          debug_log(
            "Black sibling and red parent case - done", path, path.parent());
          break;
        }
        // Handle black sibling and niblings and black parent.
        debug_log(
          "Black sibling, niblings and black parent case", path, path.parent());
        Rep::set_red(sibling, true);
        path.pop();
        invariant(path.curr());
        debug_log(
          "Black sibling, niblings and black parent case - done",
          path,
          path.curr());
      }
      return true;
    }